

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON_3fPoint * __thiscall ON_3fPoint::operator=(ON_3fPoint *this,double *p)

{
  double *p_local;
  ON_3fPoint *this_local;
  
  if (p == (double *)0x0) {
    this->z = 0.0;
    this->y = 0.0;
    this->x = 0.0;
  }
  else {
    this->x = (float)*p;
    this->y = (float)p[1];
    this->z = (float)p[2];
  }
  return this;
}

Assistant:

ON_3fPoint& ON_3fPoint::operator=(const double* p)
{
  if ( p ) {
    x = (float)p[0];
    y = (float)p[1];
    z = (float)p[2];
  }
  else {
    x = y = z = 0.0;
  }
  return *this;
}